

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

STAmount * jbcoin::amountFromString(STAmount *__return_storage_ptr__,Issue *issue,string *amount)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  const_reference pvVar6;
  const_reference m2;
  unsigned_long mantissa;
  long lVar7;
  int iVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  smatch match;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  STAmount local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((amountFromString(jbcoin::Issue_const&,std::__cxx11::string_const&)::reNumber == '\0') &&
     (iVar8 = __cxa_guard_acquire(&amountFromString(jbcoin::Issue_const&,std::__cxx11::string_const&)
                                   ::reNumber), iVar8 != 0)) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex(&amountFromString::reNumber,
                "^([-+]?)(0|[1-9][0-9]*)(\\.([0-9]+))?([eE]([+-]?)([0-9]+))?$",0);
    __cxa_atexit(boost::
                 basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                 ~basic_regex,&amountFromString::reNumber,&__dso_handle);
    __cxa_guard_release(&amountFromString(jbcoin::Issue_const&,std::__cxx11::string_const&)::
                         reNumber);
  }
  match.m_null.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .first._M_current = (char *)0x0;
  match.m_null.
  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .second._M_current = (char *)0x0;
  match.m_subs.
  super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match.m_base._M_current = (char *)0x0;
  match.m_subs.
  super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.m_subs.
  super__Vector_base<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  match.m_null.matched = false;
  match.m_named_subs.px = (element_type *)0x0;
  match.m_named_subs.pn.pi_ = (sp_counted_base *)0x0;
  match.m_last_closed_paren = 0;
  match.m_is_singular = true;
  bVar3 = boost::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                    (amount,&match,&amountFromString::reNumber,format_default);
  if (!bVar3) {
    std::operator+(&local_118,"Number \'",amount);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                   &local_118,"\' is not valid");
    Throw<std::runtime_error,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8);
  }
  pvVar6 = boost::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](&match,2);
  bVar3 = pvVar6->matched;
  pcVar1 = (pvVar6->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).first._M_current;
  pcVar2 = (pvVar6->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current;
  pvVar6 = boost::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](&match,4);
  lVar9 = (long)pcVar2 - (long)pcVar1;
  if (bVar3 == false) {
    lVar9 = 0;
  }
  lVar7 = (long)(pvVar6->
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).second._M_current -
          (long)(pvVar6->
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).first._M_current;
  if (pvVar6->matched == false) {
    lVar7 = 0;
  }
  if (0x20 < lVar7 + lVar9) {
    std::operator+(&local_118,"Number \'",amount);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                   &local_118,"\' is overlong");
    Throw<std::runtime_error,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8);
  }
  pvVar6 = boost::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](&match,1);
  if (pvVar6->matched == true) {
    pvVar6 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&match,1);
    bVar3 = boost::operator==(pvVar6,"-");
  }
  else {
    bVar3 = false;
  }
  STAmount::STAmount(&local_b8,issue,0,0,false);
  bVar4 = beast::operator==(&local_b8.mIssue);
  if ((bVar4) &&
     (pvVar6 = boost::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&match,3), pvVar6->matched == true)) {
    Throw<std::runtime_error,char_const(&)[41]>
              ((char (*) [41])"XRP must be specified in integral drops.");
  }
  pvVar6 = boost::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](&match,4);
  if (pvVar6->matched == false) {
    pvVar6 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&match,2);
    boost::sub_match::operator_cast_to_string(&local_d8,(sub_match *)pvVar6);
    mantissa = beast::lexicalCastThrow<unsigned_long,std::__cxx11::string>(&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    iVar8 = 0;
  }
  else {
    pvVar6 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&match,2);
    m2 = boost::
         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator[](&match,4);
    boost::operator+(&local_f8,pvVar6,m2);
    mantissa = beast::lexicalCastThrow<unsigned_long,std::__cxx11::string>(&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    pvVar6 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&match,4);
    iVar8 = 0;
    if (pvVar6->matched != false) {
      iVar8 = *(int *)&(pvVar6->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current -
              *(int *)&(pvVar6->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current;
    }
  }
  pvVar6 = boost::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](&match,5);
  if (pvVar6->matched != true) goto LAB_001d858e;
  pvVar6 = boost::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[](&match,6);
  if (pvVar6->matched == true) {
    pvVar6 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&match,6);
    bVar4 = boost::operator==(pvVar6,"-");
    if (!bVar4) goto LAB_001d8558;
    pvVar6 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&match,7);
    boost::sub_match::operator_cast_to_string(&local_50,(sub_match *)pvVar6);
    in = &local_50;
    iVar5 = beast::lexicalCastThrow<int,std::__cxx11::string>(in);
    iVar5 = -iVar5;
  }
  else {
LAB_001d8558:
    pvVar6 = boost::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&match,7);
    boost::sub_match::operator_cast_to_string(&local_70,(sub_match *)pvVar6);
    in = &local_70;
    iVar5 = beast::lexicalCastThrow<int,std::__cxx11::string>(in);
  }
  iVar8 = iVar8 + iVar5;
  std::__cxx11::string::~string((string *)in);
LAB_001d858e:
  STAmount::STAmount(__return_storage_ptr__,issue,mantissa,iVar8,bVar3);
  boost::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results(&match);
  return __return_storage_ptr__;
}

Assistant:

STAmount
amountFromString (Issue const& issue, std::string const& amount)
{
    static boost::regex const reNumber (
        "^"                       // the beginning of the string
        "([-+]?)"                 // (optional) + or - character
        "(0|[1-9][0-9]*)"         // a number (no leading zeroes, unless 0)
        "(\\.([0-9]+))?"          // (optional) period followed by any number
        "([eE]([+-]?)([0-9]+))?"  // (optional) E, optional + or -, any number
        "$",
        boost::regex_constants::optimize);

    boost::smatch match;

    if (!boost::regex_match (amount, match, reNumber))
        Throw<std::runtime_error> ("Number '" + amount + "' is not valid");

    // Match fields:
    //   0 = whole input
    //   1 = sign
    //   2 = integer portion
    //   3 = whole fraction (with '.')
    //   4 = fraction (without '.')
    //   5 = whole exponent (with 'e')
    //   6 = exponent sign
    //   7 = exponent number

    // CHECKME: Why 32? Shouldn't this be 16?
    if ((match[2].length () + match[4].length ()) > 32)
        Throw<std::runtime_error> ("Number '" + amount + "' is overlong");

    bool negative = (match[1].matched && (match[1] == "-"));

    // Can't specify XRP using fractional representation
    if (isXRP(issue) && match[3].matched)
        Throw<std::runtime_error> ("XRP must be specified in integral drops.");

    std::uint64_t mantissa;
    int exponent;

    if (!match[4].matched) // integer only
    {
        mantissa = beast::lexicalCastThrow <std::uint64_t> (std::string (match[2]));
        exponent = 0;
    }
    else
    {
        // integer and fraction
        mantissa = beast::lexicalCastThrow <std::uint64_t> (match[2] + match[4]);
        exponent = -(match[4].length ());
    }

    if (match[5].matched)
    {
        // we have an exponent
        if (match[6].matched && (match[6] == "-"))
            exponent -= beast::lexicalCastThrow <int> (std::string (match[7]));
        else
            exponent += beast::lexicalCastThrow <int> (std::string (match[7]));
    }

    return { issue, mantissa, exponent, negative };
}